

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O0

MPP_RET hal_h264e_vepu580_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint local_64;
  uint local_60;
  RK_U32 madi_cnt;
  RK_U32 md_cnt;
  RK_U32 madp_th_cnt3;
  RK_U32 madp_th_cnt2;
  RK_U32 madp_th_cnt1;
  RK_U32 madi_th_cnt3;
  RK_U32 madi_th_cnt2;
  RK_U32 madi_th_cnt1;
  RK_U32 mbs;
  RK_U32 mb_h;
  RK_U32 mb_w;
  EncRcTaskInfo *rc_info;
  HalVepu580RegSet *regs;
  HalH264eVepu580Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar5 = *(long *)((long)hal + 0x1a0) + (long)(task->flags).reg_idx * 0x1cb8;
  pEVar1 = task->rc_task;
  uVar2 = *(int *)(*(long *)((long)hal + 0x60) + 0x3c) *
          *(int *)(*(long *)((long)hal + 0x60) + 0x40);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_ret_task",hal);
  }
  task->length = task->hw_length + task->length;
  (pEVar1->info).bit_real = task->hw_length << 3;
  (pEVar1->info).quality_real = *(uint *)(lVar5 + 0x169c) / uVar2;
  if ((*(uint *)(lVar5 + 0x17bc) & 0x7fffff) == 0) {
    local_60 = 0;
  }
  else {
    local_60 = *(uint *)(lVar5 + 0x17b8) / (*(uint *)(lVar5 + 0x17bc) & 0x7fffff);
  }
  (pEVar1->info).madi = local_60;
  if ((*(uint *)(lVar5 + 0x17b4) & 0x1fffff) == 0) {
    local_64 = 0;
  }
  else {
    local_64 = *(uint *)(lVar5 + 0x17b0) / (*(uint *)(lVar5 + 0x17b4) & 0x1fffff);
  }
  (pEVar1->info).madp = local_64;
  (pEVar1->info).iblk4_prop =
       (((*(uint *)(lVar5 + 0x17ac) & 0x7fffff) + (*(uint *)(lVar5 + 0x17a8) & 0x7fffff) +
        (*(uint *)(lVar5 + 0x17a4) & 0x1fffff)) * 0x100) / uVar2;
  (pEVar1->info).sse =
       (ulong)*(uint *)(lVar5 + 0x1698) * 0x10000 + (long)(int)(*(uint *)(lVar5 + 0x1694) >> 0x10);
  (pEVar1->info).lvl16_inter_num = *(uint *)(lVar5 + 0x1798) & 0x1fffff;
  (pEVar1->info).lvl8_inter_num = *(uint *)(lVar5 + 0x179c) & 0x7fffff;
  (pEVar1->info).lvl16_intra_num = *(uint *)(lVar5 + 0x17a4) & 0x1fffff;
  (pEVar1->info).lvl8_intra_num = *(uint *)(lVar5 + 0x17a8) & 0x7fffff;
  (pEVar1->info).lvl4_intra_num = *(uint *)(lVar5 + 0x17ac) & 0x7fffff;
  *(RK_S32 *)((long)hal + 0xb0) = (pEVar1->info).bit_real;
  *(RK_S32 *)((long)hal + 0xb4) = (pEVar1->info).quality_real;
  *(RK_U32 *)((long)hal + 0xc0) = (pEVar1->info).iblk4_prop;
  (task->hal_ret).data = (void *)((long)hal + 0x90);
  (task->hal_ret).number = 1;
  uVar3 = (uint)(*(int *)(*(long *)((long)hal + 0x1d0) + 0x17d0) * 0x18 +
                 *(int *)(*(long *)((long)hal + 0x1d0) + 0x17cc) * 0x16 +
                *(int *)(*(long *)((long)hal + 0x1d0) + 0x17c8) * 0x11) >> 2;
  uVar4 = (uint)(*(int *)(*(long *)((long)hal + 0x1d0) + 0x17e0) * 6 +
                 *(int *)(*(long *)((long)hal + 0x1d0) + 0x17dc) * 5 +
                *(int *)(*(long *)((long)hal + 0x1d0) + 0x17d8) * 4) >> 2;
  (pEVar1->info).motion_level = 0;
  if (uVar2 * 0xf < uVar3 * 100) {
    (pEVar1->info).motion_level = 200;
  }
  else if (uVar2 * 5 < uVar3 * 100) {
    (pEVar1->info).motion_level = 100;
  }
  else {
    (pEVar1->info).motion_level = 0;
  }
  (pEVar1->info).complex_level = 0;
  if (uVar2 * 0x1e < uVar4 * 100) {
    (pEVar1->info).complex_level = 2;
  }
  else if (uVar2 * 0xd < uVar4 * 100) {
    (pEVar1->info).complex_level = 1;
  }
  else {
    (pEVar1->info).complex_level = 0;
  }
  if ((hal_h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","motion_level %u, complex_level %u\n",
               "hal_h264e_vepu580_ret_task",(ulong)(pEVar1->info).motion_level,
               (ulong)(pEVar1->info).complex_level);
  }
  vepu580_h264e_tune_stat_update(*(void **)((long)hal + 0x168),task);
  mpp_dev_multi_offset_reset(*(MppDevRegOffCfgs **)((long)hal + 0x38));
  if (*(long *)((long)hal + 0x70) != 0) {
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).curr_idx);
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).refr_idx);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_ret_task(void * hal, HalEncTask * task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs->reg_st.qp_sum / mbs;
    rc_info->madi = (!regs->reg_st.st_bnum_b16.num_b16) ? 0 :
                    regs->reg_st.madi /  regs->reg_st.st_bnum_b16.num_b16;
    rc_info->madp = (!regs->reg_st.st_bnum_cme.num_ctu) ? 0 :
                    regs->reg_st.madp / regs->reg_st.st_bnum_cme.num_ctu;
    rc_info->iblk4_prop = (regs->reg_st.st_pnum_i4.pnum_i4 +
                           regs->reg_st.st_pnum_i8.pnum_i8 +
                           regs->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs->reg_st.sse_h32 << 16) + (regs->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    //RK_U32 madi_th_cnt0 = ctx->regs_set->reg_st.madi_b16num0;
    RK_U32 madi_th_cnt1 = ctx->regs_set->reg_st.madi_b16num1;
    RK_U32 madi_th_cnt2 = ctx->regs_set->reg_st.madi_b16num2;
    RK_U32 madi_th_cnt3 = ctx->regs_set->reg_st.madi_b16num3;
    //RK_U32 madp_th_cnt0 = ctx->regs_set->reg_st.md_sad_b16num0;
    RK_U32 madp_th_cnt1 = ctx->regs_set->reg_st.md_sad_b16num1;
    RK_U32 madp_th_cnt2 = ctx->regs_set->reg_st.md_sad_b16num2;
    RK_U32 madp_th_cnt3 = ctx->regs_set->reg_st.md_sad_b16num3;

    RK_U32 md_cnt = (24 * madp_th_cnt3 + 22 * madp_th_cnt2 + 17 * madp_th_cnt1) >> 2;
    RK_U32 madi_cnt = (6 * madi_th_cnt3 + 5 * madi_th_cnt2 + 4 * madi_th_cnt1) >> 2;

    rc_info->motion_level = 0;
    if (md_cnt * 100 > 15 * mbs)
        rc_info->motion_level = 200;
    else if (md_cnt * 100 > 5 * mbs)
        rc_info->motion_level = 100;
    else
        rc_info->motion_level = 0;

    rc_info->complex_level = 0;
    if (madi_cnt * 100 > 30 * mbs)
        rc_info->complex_level = 2;
    else if (madi_cnt * 100 > 13 * mbs)
        rc_info->complex_level = 1;
    else
        rc_info->complex_level = 0;

    hal_h264e_dbg_rc("motion_level %u, complex_level %u\n", rc_info->motion_level, rc_info->complex_level);

    vepu580_h264e_tune_stat_update(ctx->tune, task);

    mpp_dev_multi_offset_reset(ctx->offsets);

    if (ctx->dpb) {
        h264e_dpb_hal_end(ctx->dpb, task->flags.curr_idx);
        h264e_dpb_hal_end(ctx->dpb, task->flags.refr_idx);
    }

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}